

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntDrop(Vec_Int_t *p,int i)

{
  int iVar1;
  ulong uVar2;
  
  if ((-1 < i) && (i < p->nSize)) {
    iVar1 = p->nSize + -1;
    p->nSize = iVar1;
    for (uVar2 = (ulong)(uint)i; (int)uVar2 < iVar1; uVar2 = uVar2 + 1) {
      p->pArray[uVar2] = p->pArray[uVar2 + 1];
      iVar1 = p->nSize;
    }
    return;
  }
  __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
}

Assistant:

static inline void Vec_IntDrop( Vec_Int_t * p, int i )
{
    int k;
    assert( i >= 0 && i < Vec_IntSize(p) );
    p->nSize--;
    for ( k = i; k < p->nSize; k++ )
        p->pArray[k] = p->pArray[k+1];
}